

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall Lib::Stack<int>::Stack(Stack<int> *this,size_t initialCapacity)

{
  int *piVar1;
  size_t sVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    sVar2 = 0;
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)Lib::alloc(initialCapacity << 2);
    sVar2 = this->_capacity;
  }
  this->_stack = piVar1;
  this->_cursor = piVar1;
  this->_end = piVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }